

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

string * __thiscall
deqp::sl::ShaderCase::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  bool bVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  string *name;
  Value *val_1;
  int ndx_1;
  char *typeStr;
  DataType floatType;
  Value *val;
  int ndx;
  char *vtxOut;
  char *vtxIn;
  undefined1 local_198 [7];
  bool usesInout;
  ostringstream res;
  ValueBlock *valueBlock_local;
  ShaderCase *this_local;
  
  res._368_8_ = valueBlock;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  bVar1 = usesShaderInoutQualifiers(this->m_targetVersion);
  pcVar8 = "attribute";
  if (bVar1) {
    pcVar8 = "in";
  }
  pcVar9 = "varying";
  if (bVar1) {
    pcVar9 = "out";
  }
  pcVar3 = glu::getGLSLVersionDeclaration(this->m_targetVersion);
  poVar4 = std::operator<<((ostream *)local_198,pcVar3);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)local_198,"precision highp float;\n");
  std::operator<<((ostream *)local_198,"precision highp int;\n");
  std::operator<<((ostream *)local_198,"\n");
  poVar4 = std::operator<<((ostream *)local_198,pcVar8);
  std::operator<<(poVar4," highp vec4 dEQP_Position;\n");
  for (val._4_4_ = 0;
      sVar5 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      *)(res._368_8_ + 8)), val._4_4_ < (int)sVar5; val._4_4_ = val._4_4_ + 1) {
    pvVar6 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[]((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                           *)(res._368_8_ + 8),(long)val._4_4_);
    if (pvVar6->storageType == STORAGE_INPUT) {
      DVar2 = glu::getDataTypeFloatScalars(pvVar6->dataType);
      pcVar3 = glu::getDataTypeName(DVar2);
      poVar4 = std::operator<<((ostream *)local_198,pcVar8);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4," a_");
      poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
      std::operator<<(poVar4,";\n");
      DVar2 = glu::getDataTypeScalarType(pvVar6->dataType);
      if (DVar2 == TYPE_FLOAT) {
        poVar4 = std::operator<<((ostream *)local_198,pcVar9);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,";\n");
      }
      else {
        poVar4 = std::operator<<((ostream *)local_198,pcVar9);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4," v_");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,";\n");
      }
    }
  }
  std::operator<<((ostream *)local_198,"\n");
  std::operator<<((ostream *)local_198,"void main()\n");
  std::operator<<((ostream *)local_198,"{\n");
  std::operator<<((ostream *)local_198,"    gl_Position = dEQP_Position;\n");
  for (val_1._4_4_ = 0;
      sVar5 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      *)(res._368_8_ + 8)), val_1._4_4_ < (int)sVar5; val_1._4_4_ = val_1._4_4_ + 1)
  {
    pvVar6 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[]((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                           *)(res._368_8_ + 8),(long)val_1._4_4_);
    if (pvVar6->storageType == STORAGE_INPUT) {
      psVar7 = &pvVar6->valueName;
      DVar2 = glu::getDataTypeScalarType(pvVar6->dataType);
      if (DVar2 == TYPE_FLOAT) {
        poVar4 = std::operator<<((ostream *)local_198,"    ");
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," = a_");
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        std::operator<<(poVar4,";\n");
      }
      else {
        poVar4 = std::operator<<((ostream *)local_198,"    v_");
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," = a_");
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        std::operator<<(poVar4,";\n");
      }
    }
  }
  std::operator<<((ostream *)local_198,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string ShaderCase::genVertexShader(const ValueBlock& valueBlock)
{
	ostringstream res;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	res << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	// Declarations (position + attribute/varying for each input).
	res << "precision highp float;\n";
	res << "precision highp int;\n";
	res << "\n";
	res << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			DataType	floatType = getDataTypeFloatScalars(val.dataType);
			const char* typeStr   = getDataTypeName(floatType);
			res << vtxIn << " " << typeStr << " a_" << val.valueName << ";\n";

			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << vtxOut << " " << typeStr << " " << val.valueName << ";\n";
			else
				res << vtxOut << " " << typeStr << " v_" << val.valueName << ";\n";
		}
	}
	res << "\n";

	// Main function.
	// - gl_Position = dEQP_Position;
	// - for each input: write attribute directly to varying
	res << "void main()\n";
	res << "{\n";
	res << "    gl_Position = dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			const string& name = val.valueName;
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << "    " << name << " = a_" << name << ";\n";
			else
				res << "    v_" << name << " = a_" << name << ";\n";
		}
	}

	res << "}\n";
	return res.str();
}